

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  byte *pbVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  dynbuf escaped;
  byte *local_58;
  dynbuf local_50;
  
  curlx_dyn_init(&local_50,0x1f43);
  if (len == -1) {
    len = strlen(str);
  }
  CVar2 = curlx_dyn_addn(&local_50,"",0);
  bVar6 = CVar2 == CURLE_OK;
  pbVar4 = (byte *)str;
  local_58 = (byte *)str;
  if (len != 0 && bVar6) {
    sVar5 = 2000;
    if (len < 2000) {
      sVar5 = len;
    }
    do {
      bVar1 = *pbVar4;
      pcVar3 = (char *)memchr("\t\r\n?\"\\",(int)(char)bVar1,7);
      if ((pcVar3 != (char *)0x0) || ((byte)(bVar1 + 0x81) < 0xa1 && (byte)(bVar1 - 0xe) < 0xfb)) {
        CVar2 = curlx_dyn_addn(&local_50,local_58,(long)str - (long)local_58);
        local_58 = pbVar4 + 1;
        if (CVar2 == CURLE_OK) {
          if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
            pcVar3 = "\\x%02x";
            if (1 < (long)sVar5) {
              bVar1 = *local_58;
              pcVar3 = "\\%03o";
              if (((5 < (byte)(bVar1 + 0x9f) && 9 < (byte)(bVar1 - 0x30)) &&
                  (pcVar3 = "\\x%02x", '@' < (char)bVar1)) && (pcVar3 = "\\x%02x", bVar1 < 0x47)) {
                pcVar3 = "\\%03o";
              }
            }
            CVar2 = curlx_dyn_addf(&local_50,pcVar3,(ulong)*pbVar4);
          }
          else {
            CVar2 = curlx_dyn_addn(&local_50,"\\t\\r\\n\\?\\\"\\\\" + (long)(pcVar3 + -0x129e74) * 2
                                   ,2);
          }
        }
      }
      pbVar4 = pbVar4 + 1;
      bVar6 = CVar2 == CURLE_OK;
      if (!bVar6) break;
      str = str + 1;
      bVar7 = sVar5 != 1;
      sVar5 = sVar5 - 1;
    } while (bVar7);
  }
  if ((bVar6) &&
     (CVar2 = curlx_dyn_addn(&local_50,local_58,(long)pbVar4 - (long)local_58), CVar2 == CURLE_OK))
  {
    curlx_dyn_addn(&local_50,"...",(ulong)(2000 < len) * 3);
  }
  pcVar3 = curlx_dyn_ptr(&local_50);
  return pcVar3;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned int cutoff = 0;
  CURLcode result;
  struct curlx_dynbuf escaped;

  curlx_dyn_init(&escaped, 4 * MAX_STRING_LENGTH_OUTPUT + 3);

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  result = curlx_dyn_addn(&escaped, STRCONST(""));
  for(s = str; !result && len; s++, len--) {
    /* escape question marks as well, to prevent generating accidental
       trigraphs */
    static const char from[] = "\t\r\n?\"\\";
    static const char to[] = "\\t\\r\\n\\?\\\"\\\\";
    const char *p = strchr(from, *s);

    if(!p && ISPRINT(*s))
      continue;

    result = curlx_dyn_addn(&escaped, str, s - str);
    str = s + 1;

    if(!result) {
      if(p && *p)
        result = curlx_dyn_addn(&escaped, to + 2 * (p - from), 2);
      else {
        result = curlx_dyn_addf(&escaped,
                                /* Octal escape to avoid >2 digit hex. */
                                (len > 1 && ISXDIGIT(s[1])) ?
                                  "\\%03o" : "\\x%02x",
                                (unsigned int) *(const unsigned char *) s);
      }
    }
  }

  if(!result)
    result = curlx_dyn_addn(&escaped, str, s - str);

  if(!result)
    (void) !curlx_dyn_addn(&escaped, "...", cutoff);

  return curlx_dyn_ptr(&escaped);
}